

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flag.cc
# Opt level: O0

void __thiscall
absl::lts_20240722::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip(FlagImpl *this)

{
  bool bVar1;
  Mutex *mu;
  char *pcVar2;
  string *in_R9;
  undefined1 auVar3 [16];
  string_view text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  AlphaNum local_1d8;
  string local_1a8;
  AlphaNum local_188;
  AlphaNum local_158;
  string_view local_128;
  AlphaNum local_118;
  AlphaNum local_e8;
  string local_b8;
  int local_98 [2];
  char *local_90;
  char *absl_raw_log_internal_filename;
  size_t local_80;
  string local_78 [8];
  string error;
  unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> dst;
  MutexLock local_38;
  MutexLock lock;
  string v;
  FlagImpl *this_local;
  
  DefaultValue_abi_cxx11_((string *)&lock,this);
  mu = DataGuard(this);
  MutexLock::MutexLock(&local_38,mu);
  MakeInitValue((FlagImpl *)((long)&error.field_2 + 8));
  std::__cxx11::string::string(local_78);
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this->op_;
  auVar3 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)&lock);
  local_80 = auVar3._8_8_;
  absl_raw_log_internal_filename = auVar3._0_8_;
  pcVar2 = (char *)std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::get
                             ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>
                               *)((long)&error.field_2 + 8));
  text._M_str = pcVar2;
  text._M_len = local_80;
  bVar1 = Parse((flags_internal *)args_2,(FlagOpFn)absl_raw_log_internal_filename,text,local_78,
                in_R9);
  if (!bVar1) {
    local_90 = 
    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
    ;
    local_98[1] = 3;
    local_98[0] = 0x2ad;
    AlphaNum::AlphaNum(&local_e8,"Flag ");
    local_128 = Name(this);
    AlphaNum::AlphaNum(&local_118,local_128);
    AlphaNum::AlphaNum(&local_158," (from ");
    Filename_abi_cxx11_(&local_1a8,this);
    AlphaNum::AlphaNum<std::allocator<char>>(&local_188,&local_1a8);
    AlphaNum::AlphaNum(&local_1d8,"): string form of default value \'");
    StrCat<std::__cxx11::string,char[30],std::__cxx11::string>
              (&local_b8,(lts_20240722 *)&local_e8,&local_118,&local_158,&local_188,&local_1d8,
               (AlphaNum *)&lock,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               "\' could not be parsed; error=",(char (*) [30])local_78,args_2);
    base_internal::
    AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
    ::operator()((AtomicHook<void(*)(absl::lts_20240722::LogSeverity,char_const*,int,std::__cxx11::string_const&)>
                  *)&raw_log_internal::internal_log_function_abi_cxx11_,
                 (LogSeverity *)(local_98 + 1),&local_90,local_98,&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_1a8);
    __assert_fail("false && \"ABSL_UNREACHABLE reached\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/flags/internal/flag.cc"
                  ,0x2ad,
                  "virtual void absl::flags_internal::FlagImpl::CheckDefaultValueParsingRoundtrip() const"
                 );
  }
  std::__cxx11::string::~string(local_78);
  std::unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter>::~unique_ptr
            ((unique_ptr<void,_absl::lts_20240722::flags_internal::DynValueDeleter> *)
             ((long)&error.field_2 + 8));
  MutexLock::~MutexLock(&local_38);
  std::__cxx11::string::~string((string *)&lock);
  return;
}

Assistant:

void FlagImpl::CheckDefaultValueParsingRoundtrip() const {
  std::string v = DefaultValue();

  absl::MutexLock lock(DataGuard());

  auto dst = MakeInitValue();
  std::string error;
  if (!flags_internal::Parse(op_, v, dst.get(), &error)) {
    ABSL_INTERNAL_LOG(
        FATAL,
        absl::StrCat("Flag ", Name(), " (from ", Filename(),
                     "): string form of default value '", v,
                     "' could not be parsed; error=", error));
  }

  // We do not compare dst to def since parsing/unparsing may make
  // small changes, e.g., precision loss for floating point types.
}